

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  ImVector<ImGuiColumns> *this_00;
  ImGuiColumns *pIVar1;
  int i;
  int i_00;
  
  if (this->DrawList == &this->DrawListInst) {
    IM_DELETE<char>(this->Name);
    this_00 = &this->ColumnsStorage;
    for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
      pIVar1 = ImVector<ImGuiColumns>::operator[](this_00,i_00);
      ImVector<ImGuiColumnData>::~ImVector(&pIVar1->Columns);
    }
    ImDrawList::~ImDrawList(&this->DrawListInst);
    ImVector<ImGuiColumns>::~ImVector(this_00);
    ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->StateStorage).Data);
    ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
    ImVector<unsigned_int>::~ImVector(&this->IDStack);
    return;
  }
  __assert_fail("DrawList == &DrawListInst",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                ,0x9ec,"ImGuiWindow::~ImGuiWindow()");
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}